

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O1

void __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::Initialize
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this,
          IMemoryAllocator *RawAllocator,PipelineResourceSignatureDesc *Desc,
          bool CreateImmutableSamplers,function<void_()> *InitResourceLayout,
          function<unsigned_long_()> *GetRequiredResourceCacheMemorySize,
          AllocResourceAttribsCallbackType *AllocResourceAttribs,
          AllocImmutableSamplerAttribsCallbackType *AllocImmutableSampler)

{
  size_t sVar1;
  char cVar2;
  uint uVar3;
  void *ptr;
  undefined4 uVar4;
  SHADER_TYPE SVar5;
  ulong uVar6;
  PipelineResourceAttribsVk *pPVar7;
  ShaderResourceCacheVk *this_00;
  ShaderVariableManagerImplType *pSVar8;
  ImmutableSamplerAttribsType *__s;
  RefCntAutoPtr<Diligent::SamplerVkImpl> *__s_00;
  RenderDeviceVkImpl *pRVar9;
  pointer pcVar10;
  uint uVar11;
  undefined7 in_register_00000009;
  array<unsigned_short,_4UL> *paVar12;
  PipelineResourceSignatureType **ppPVar13;
  long lVar14;
  Uint32 VarType;
  ulong uVar15;
  long *plVar16;
  Uint32 i;
  Uint32 s;
  long lVar17;
  string msg;
  SHADER_RESOURCE_VARIABLE_TYPE AllowedVarTypes [1];
  FixedLinearAllocator Allocator;
  string local_f8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  SHADER_TYPE local_bc;
  array<unsigned_short,_4UL> local_b8;
  undefined4 local_ac;
  IMemoryAllocator *local_a8;
  _Any_data *local_a0;
  _Any_data *local_98;
  array<unsigned_short,_4UL> *local_90;
  FixedLinearAllocator local_88;
  
  local_88.m_ReservedSize = 0;
  local_88.m_CurrAlignment = 0;
  local_88.m_pDataStart = (uint8_t *)0x0;
  local_88.m_pCurrPtr = (uint8_t *)0x0;
  local_88.m_DbgCurrAllocation = 0;
  local_88.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.m_DbgUsingExternalMemory = false;
  local_a8 = RawAllocator;
  local_88.m_pAllocator = RawAllocator;
  ReserveSpaceForPipelineResourceSignatureDesc(&local_88,Desc);
  FixedLinearAllocator::AddSpace(&local_88,(ulong)Desc->NumResources << 4,4);
  local_bc = this->m_StaticResShaderStages;
  uVar11 = local_bc - (local_bc >> 1 & 0x55555555);
  uVar11 = (uVar11 >> 2 & 0x33333333) + (uVar11 & 0x33333333);
  uVar11 = ((uVar11 >> 4) + uVar11 & 0xf0f0f0f) * 0x1010101 >> 0x18;
  if (local_bc != SHADER_TYPE_UNKNOWN) {
    FixedLinearAllocator::AddSpace(&local_88,0x38,8);
    FixedLinearAllocator::AddSpace(&local_88,(ulong)(uVar11 * 0x30),8);
  }
  local_a0 = (_Any_data *)GetRequiredResourceCacheMemorySize;
  local_98 = (_Any_data *)InitResourceLayout;
  FixedLinearAllocator::AddSpace(&local_88,(ulong)Desc->NumImmutableSamplers << 3,4);
  if (CreateImmutableSamplers) {
    FixedLinearAllocator::AddSpace(&local_88,(ulong)Desc->NumImmutableSamplers << 3,8);
  }
  FixedLinearAllocator::Reserve(&local_88);
  local_88.m_pAllocator = (IMemoryAllocator *)0x0;
  local_f8._M_dataplus._M_p = (pointer)local_a8;
  local_f8._M_string_length = 0;
  ptr = (this->m_pRawMemory)._M_t.
        super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
        super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
        super__Head_base<0UL,_void_*,_false>._M_head_impl;
  (this->m_pRawMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = local_88.m_pDataStart;
  if (ptr != (void *)0x0) {
    STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
              ((STDDeleter<void,_Diligent::IMemoryAllocator> *)&this->m_pRawMemory,ptr);
  }
  (this->m_pRawMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>._M_head_impl
       = (STDDeleter<void,_Diligent::IMemoryAllocator>)local_f8._M_dataplus._M_p;
  local_f8._M_dataplus._M_p = (pointer)0x0;
  if ((void *)local_f8._M_string_length != (void *)0x0) {
    STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
              ((STDDeleter<void,_Diligent::IMemoryAllocator> *)&local_f8,
               (void *)local_f8._M_string_length);
  }
  paVar12 = &this->m_ResourceOffsets;
  local_90 = paVar12;
  CopyPipelineResourceSignatureDesc
            (&local_88,Desc,
             &(this->
              super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
              ).m_Desc,paVar12);
  if ((this->
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
      ).m_Desc.NumResources != (uint)(this->m_ResourceOffsets)._M_elems[3]) {
    FormatString<char[26],char[88]>
              (&local_f8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_ResourceOffsets[SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES] == this->m_Desc.NumResources"
               ,(char (*) [88])paVar12);
    DebugAssertionFailed
              (local_f8._M_dataplus._M_p,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x33d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
  }
  local_ac = (undefined4)CONCAT71(in_register_00000009,CreateImmutableSamplers);
  uVar15 = 0;
  do {
    uVar6 = (ulong)local_90->_M_elems[uVar15];
    paVar12 = local_90;
    if (local_90->_M_elems[uVar15] < local_90->_M_elems[uVar15 + 1]) {
      paVar12 = (array<unsigned_short,_4UL> *)(uVar6 * 3);
      lVar17 = uVar6 * 0x18 + 0x11;
      lVar14 = local_90->_M_elems[uVar15 + 1] - uVar6;
      do {
        if (uVar15 != *(byte *)((long)&((this->
                                        super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                        ).m_Desc.Resources)->Name + lVar17)) {
          FormatString<char[29]>(&local_f8,(char (*) [29])"Unexpected resource var type");
          paVar12 = (array<unsigned_short,_4UL> *)0x342;
          DebugAssertionFailed
                    (local_f8._M_dataplus._M_p,"Initialize",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                     ,0x342);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
        }
        lVar17 = lVar17 + 0x18;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
    uVar4 = local_ac;
    uVar15 = uVar15 + 1;
  } while (uVar15 != 3);
  if ((AllocResourceAttribs->super__Function_base)._M_manager == (_Manager_type)0x0) {
    pPVar7 = (PipelineResourceAttribsVk *)
             FixedLinearAllocator::Allocate(&local_88,(ulong)Desc->NumResources << 4,4);
  }
  else {
    pPVar7 = (*AllocResourceAttribs->_M_invoker)((_Any_data *)AllocResourceAttribs,&local_88);
  }
  this->m_pResourceAttribs = pPVar7;
  if (local_bc != SHADER_TYPE_UNKNOWN) {
    this_00 = (ShaderResourceCacheVk *)FixedLinearAllocator::Allocate(&local_88,0x38,8);
    ShaderResourceCacheVk::ShaderResourceCacheVk(this_00,Signature);
    this->m_pStaticResCache = this_00;
    pSVar8 = (ShaderVariableManagerImplType *)
             FixedLinearAllocator::Allocate(&local_88,(ulong)(uVar11 << 4) * 3,8);
    uVar15 = (ulong)uVar11;
    ppPVar13 = &(pSVar8->
                super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
                ).m_pSignature;
    do {
      ((ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl> *)
      (ppPVar13 + -2))->m_Owner = (IObject *)this;
      ppPVar13[-1] = (PipelineResourceSignatureType *)this_00;
      *ppPVar13 = (PipelineResourceSignatureType *)0x0;
      ppPVar13[1] = (PipelineResourceSignatureType *)0x0;
      *(undefined8 *)((long)ppPVar13 + 0xc) = 0;
      *(undefined8 *)((long)ppPVar13 + 0x14) = 0;
      ppPVar13 = ppPVar13 + 6;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
    this->m_StaticVarsMgrs = pSVar8;
    paVar12 = (array<unsigned_short,_4UL> *)0x0;
  }
  if ((AllocImmutableSampler->super__Function_base)._M_manager == (_Manager_type)0x0) {
    uVar3 = Desc->NumImmutableSamplers;
    sVar1 = (ulong)uVar3 * 8;
    __s = (ImmutableSamplerAttribsType *)FixedLinearAllocator::Allocate(&local_88,sVar1,4);
    if (uVar3 != 0) {
      memset(__s,0xff,sVar1);
    }
  }
  else {
    __s = (ImmutableSamplerAttribsType *)
          (*AllocImmutableSampler->_M_invoker)((_Any_data *)AllocImmutableSampler,&local_88);
  }
  this->m_pImmutableSamplerAttribs = __s;
  if ((char)uVar4 != '\0') {
    uVar3 = Desc->NumImmutableSamplers;
    sVar1 = (ulong)uVar3 * 8;
    __s_00 = (RefCntAutoPtr<Diligent::SamplerVkImpl> *)
             FixedLinearAllocator::Allocate(&local_88,sVar1,8);
    if (uVar3 != 0) {
      memset(__s_00,0,sVar1);
    }
    this->m_pImmutableSamplers = __s_00;
    if (((this->
         super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
         ).m_pDevice != (RenderDeviceVkImpl *)0x0) &&
       (pRVar9 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                 ::GetDevice(&this->
                              super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                            ), Desc->NumImmutableSamplers != 0)) {
      lVar14 = 0x10;
      lVar17 = 0;
      uVar15 = 0;
      do {
        plVar16 = (long *)((long)&this->m_pImmutableSamplers->m_pObject + lVar17);
        (**(code **)((long)(pRVar9->
                           super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                           ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
                           super_ObjectBase<Diligent::IRenderDeviceVk>.
                           super_RefCountedObject<Diligent::IRenderDeviceVk>.super_IRenderDeviceVk.
                           super_IRenderDevice.super_IObject + 0x38))
                  (pRVar9,(long)(Desc->ImmutableSamplers->Desc).BorderColor + lVar14 + -0x2c,plVar16
                  );
        if (*plVar16 == 0) {
          FormatString<char[26],char[9]>
                    (&local_f8,(Diligent *)"Debug expression failed:\n",(char (*) [26])"pSampler",
                     (char (*) [9])paVar12);
          paVar12 = (array<unsigned_short,_4UL> *)0x364;
          DebugAssertionFailed
                    (local_f8._M_dataplus._M_p,"Initialize",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                     ,0x364);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
        }
        uVar15 = uVar15 + 1;
        lVar17 = lVar17 + 8;
        lVar14 = lVar14 + 0x48;
      } while (uVar15 < Desc->NumImmutableSamplers);
    }
  }
  if (*(long *)(local_98 + 1) == 0) {
    std::__throw_bad_function_call();
  }
  (**(code **)((long)local_98 + 0x18))(local_98);
  if (local_bc != SHADER_TYPE_UNKNOWN) {
    local_b8._M_elems = local_b8._M_elems & 0xffffffffffffff00;
    lVar17 = 0;
    do {
      cVar2 = (this->m_StaticResStageIndex)._M_elems[lVar17];
      if (-1 < cVar2) {
        if (uVar11 <= (uint)(int)cVar2) {
          FormatString<char[26],char[46]>
                    (&local_f8,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"static_cast<Uint32>(Idx) < NumStaticResStages",
                     (char (*) [46])paVar12);
          DebugAssertionFailed
                    (local_f8._M_dataplus._M_p,"Initialize",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                     ,0x375);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
        }
        SVar5 = GetShaderTypeFromPipelineIndex((Int32)lVar17,this->m_PipelineType);
        paVar12 = &local_b8;
        ShaderVariableManagerVk::Initialize
                  (this->m_StaticVarsMgrs + (int)cVar2,(PipelineResourceSignatureVkImpl *)this,
                   local_a8,(SHADER_RESOURCE_VARIABLE_TYPE *)&local_b8,1,SVar5);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 6);
  }
  if (1 < Desc->SRBAllocationGranularity) {
    local_d8 = 0;
    uStack_d0 = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    local_f8.field_2._8_8_ = 0;
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    for (uVar15 = 0; uVar11 = this->m_ShaderStages - (this->m_ShaderStages >> 1 & 0x55555555),
        uVar11 = (uVar11 >> 2 & 0x33333333) + (uVar11 & 0x33333333),
        uVar15 < ((uVar11 >> 4) + uVar11 & 0xf0f0f0f) * 0x1010101 >> 0x18; uVar15 = uVar15 + 1) {
      local_b8._M_elems[0] = 0x201;
      SVar5 = GetActiveShaderStageType(this,(Uint32)uVar15);
      pcVar10 = (pointer)ShaderVariableManagerVk::GetRequiredMemorySize
                                   ((PipelineResourceSignatureVkImpl *)this,
                                    (SHADER_RESOURCE_VARIABLE_TYPE *)&local_b8,2,SVar5,(Uint32 *)0x0
                                   );
      (&local_f8._M_dataplus)[uVar15]._M_p = pcVar10;
    }
    if (*(long *)(local_a0 + 1) == 0) {
      std::__throw_bad_function_call();
    }
    local_b8._M_elems = (_Type)(**(code **)((long)local_a0 + 0x18))(local_a0);
    uVar11 = this->m_ShaderStages - (this->m_ShaderStages >> 1 & 0x55555555);
    uVar11 = (uVar11 >> 2 & 0x33333333) + (uVar11 & 0x33333333);
    SRBMemoryAllocator::Initialize
              (&this->m_SRBMemAllocator,Desc->SRBAllocationGranularity,
               ((uVar11 >> 4) + uVar11 & 0xf0f0f0f) * 0x1010101 >> 0x18,(size_t *)&local_f8,1,
               (size_t *)&local_b8);
  }
  CalculateHash(this);
  FixedLinearAllocator::~FixedLinearAllocator(&local_88);
  return;
}

Assistant:

void Initialize(IMemoryAllocator&                               RawAllocator,
                    const PipelineResourceSignatureDesc&            Desc,
                    bool                                            CreateImmutableSamplers,
                    const std::function<void()>&                    InitResourceLayout,
                    const std::function<size_t()>&                  GetRequiredResourceCacheMemorySize,
                    const AllocResourceAttribsCallbackType&         AllocResourceAttribs  = nullptr,
                    const AllocImmutableSamplerAttribsCallbackType& AllocImmutableSampler = nullptr) noexcept(false)
    {
        FixedLinearAllocator Allocator{RawAllocator};

        ReserveSpaceForPipelineResourceSignatureDesc(Allocator, Desc);

        Allocator.AddSpace<PipelineResourceAttribsType>(Desc.NumResources);

        const Uint32 NumStaticResStages = GetNumStaticResStages();
        if (NumStaticResStages > 0)
        {
            Allocator.AddSpace<ShaderResourceCacheImplType>(1);
            Allocator.AddSpace<ShaderVariableManagerImplType>(NumStaticResStages);
        }

        Allocator.AddSpace<ImmutableSamplerAttribsType>(Desc.NumImmutableSamplers);
        if (CreateImmutableSamplers)
        {
            Allocator.AddSpace<RefCntAutoPtr<SamplerImplType>>(Desc.NumImmutableSamplers);
        }

        Allocator.Reserve();
        // The memory is now owned by PipelineResourceSignatureBase and will be freed by Destruct().
        m_pRawMemory = decltype(m_pRawMemory){Allocator.ReleaseOwnership(), STDDeleterRawMem<void>{RawAllocator}};

        CopyPipelineResourceSignatureDesc(Allocator, Desc, this->m_Desc, m_ResourceOffsets);

#ifdef DILIGENT_DEBUG
        VERIFY_EXPR(m_ResourceOffsets[SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES] == this->m_Desc.NumResources);
        for (Uint32 VarType = 0; VarType < SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES; ++VarType)
        {
            const auto IdxRange = GetResourceIndexRange(static_cast<SHADER_RESOURCE_VARIABLE_TYPE>(VarType));
            for (Uint32 idx = IdxRange.first; idx < IdxRange.second; ++idx)
                VERIFY(this->m_Desc.Resources[idx].VarType == VarType, "Unexpected resource var type");
        }
#endif

        // Objects will be constructed by the specific implementation
        static_assert(std::is_trivially_destructible<PipelineResourceAttribsType>::value,
                      "PipelineResourceAttribsType objects must be constructed to be properly destructed in case an exception is thrown");
        m_pResourceAttribs = AllocResourceAttribs ?
            AllocResourceAttribs(Allocator) :
            Allocator.Allocate<PipelineResourceAttribsType>(Desc.NumResources);

        if (NumStaticResStages > 0)
        {
            m_pStaticResCache = Allocator.Construct<ShaderResourceCacheImplType>(ResourceCacheContentType::Signature);

            static_assert(std::is_nothrow_constructible<ShaderVariableManagerImplType, decltype(*this), ShaderResourceCacheImplType&>::value,
                          "Constructor of ShaderVariableManagerImplType must be noexcept, so we can safely construct all manager objects");
            m_StaticVarsMgrs = Allocator.ConstructArray<ShaderVariableManagerImplType>(NumStaticResStages, std::ref(*this), std::ref(*m_pStaticResCache));
        }

        m_pImmutableSamplerAttribs = AllocImmutableSampler ?
            static_cast<ImmutableSamplerAttribsType*>(AllocImmutableSampler(Allocator)) :
            Allocator.ConstructArray<ImmutableSamplerAttribsType>(Desc.NumImmutableSamplers);
        if (CreateImmutableSamplers)
        {
            m_pImmutableSamplers = Allocator.ConstructArray<RefCntAutoPtr<SamplerImplType>>(Desc.NumImmutableSamplers);
            if (this->HasDevice())
            {
                IRenderDevice* pDevice = this->GetDevice();
                for (Uint32 s = 0; s < Desc.NumImmutableSamplers; ++s)
                {
                    const ImmutableSamplerDesc&     ImtblSamDesc = Desc.ImmutableSamplers[s];
                    RefCntAutoPtr<SamplerImplType>& pSampler     = m_pImmutableSamplers[s];
                    pDevice->CreateSampler(ImtblSamDesc.Desc, pSampler.template RawDblPtr<ISampler>());
                    VERIFY_EXPR(pSampler);
                }
            }
        }

        InitResourceLayout();

        PipelineResourceSignatureImplType* const pThisImpl = static_cast<PipelineResourceSignatureImplType*>(this);

        if (NumStaticResStages > 0)
        {
            constexpr SHADER_RESOURCE_VARIABLE_TYPE AllowedVarTypes[] = {SHADER_RESOURCE_VARIABLE_TYPE_STATIC};
            for (Uint32 i = 0; i < m_StaticResStageIndex.size(); ++i)
            {
                Int8 Idx = m_StaticResStageIndex[i];
                if (Idx >= 0)
                {
                    VERIFY_EXPR(static_cast<Uint32>(Idx) < NumStaticResStages);
                    const SHADER_TYPE ShaderType = GetShaderTypeFromPipelineIndex(i, GetPipelineType());
                    m_StaticVarsMgrs[Idx].Initialize(*pThisImpl, RawAllocator, AllowedVarTypes, _countof(AllowedVarTypes), ShaderType);
                }
            }
        }

        if (Desc.SRBAllocationGranularity > 1)
        {
            std::array<size_t, MAX_SHADERS_IN_PIPELINE> ShaderVariableDataSizes = {};
            for (Uint32 s = 0; s < GetNumActiveShaderStages(); ++s)
            {
                constexpr SHADER_RESOURCE_VARIABLE_TYPE AllowedVarTypes[]{SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE, SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC};
                ShaderVariableDataSizes[s] = ShaderVariableManagerImplType::GetRequiredMemorySize(*pThisImpl, AllowedVarTypes, _countof(AllowedVarTypes), GetActiveShaderStageType(s));
            }

            const size_t CacheMemorySize = GetRequiredResourceCacheMemorySize();
            m_SRBMemAllocator.Initialize(Desc.SRBAllocationGranularity, GetNumActiveShaderStages(), ShaderVariableDataSizes.data(), 1, &CacheMemorySize);
        }

        pThisImpl->CalculateHash();
    }